

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

void bloaty::wasm::ReadDataSection(Section *section,IndexedNames *names,RangeSink *sink)

{
  __node_base_ptr p_Var1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  uint64_t uVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  long *plVar10;
  uint uVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  __node_base_ptr p_Var16;
  ulong filesize;
  uint __val;
  string_view name_00;
  string_view name_01;
  string name;
  string __str;
  string_view local_a8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  size_t local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  uint local_50;
  long local_48 [2];
  uint64_t local_38;
  
  local_a8._M_len = (section->contents)._M_len;
  local_a8._M_str = (section->contents)._M_str;
  __val = 0;
  local_38 = ReadLEB128Internal(false,0x20,&local_a8);
  if ((int)local_38 != 0) {
    do {
      pcVar4 = local_a8._M_str;
      sVar3 = local_a8._M_len;
      uVar7 = ReadLEB128Internal(false,0x20,&local_a8);
      if (1 < (uint)uVar7) {
        Throw("multi-memory extension isn\'t supported",0x16e);
      }
      if ((uint)uVar7 == 0) {
        SkipInitializerExpression(&local_a8);
      }
      uVar7 = ReadLEB128Internal(false,0x20,&local_a8);
      filesize = (ulong)(uint)((int)local_a8._M_str + ((int)uVar7 - (int)pcVar4));
      if (sVar3 < filesize) {
        Throw("region out-of-bounds",0x5d);
      }
      uVar15 = uVar7 & 0xffffffff;
      uVar13 = local_a8._M_len - uVar15;
      if (local_a8._M_len < uVar15) {
        Throw("region out-of-bounds",100);
      }
      local_a8._M_str = local_a8._M_str + uVar15;
      uVar15 = (names->_M_h)._M_bucket_count;
      uVar14 = (ulong)(long)(int)__val % uVar15;
      p_Var1 = (names->_M_h)._M_buckets[uVar14];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var1 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var1, p_Var16 = p_Var1->_M_nxt, __val != *(uint *)&p_Var1->_M_nxt[1]._M_nxt)) {
        while (p_Var9 = p_Var16->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)(long)(int)*(uint *)&p_Var9[1]._M_nxt % uVar15 != uVar14) ||
             (p_Var8 = p_Var16, p_Var16 = p_Var9, __val == *(uint *)&p_Var9[1]._M_nxt))
          goto LAB_0018fd20;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_0018fd20:
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var9 = p_Var8->_M_nxt;
      }
      local_a8._M_len = uVar13;
      if (p_Var9 == (_Hash_node_base *)0x0) {
        cVar6 = '\x01';
        if (9 < __val) {
          uVar15 = (ulong)__val;
          cVar5 = '\x04';
          do {
            cVar6 = cVar5;
            uVar11 = (uint)uVar15;
            if (uVar11 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_0018fdcd;
            }
            if (uVar11 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_0018fdcd;
            }
            if (uVar11 < 10000) goto LAB_0018fdcd;
            uVar15 = uVar15 / 10000;
            cVar5 = cVar6 + '\x04';
          } while (99999 < uVar11);
          cVar6 = cVar6 + '\x01';
        }
LAB_0018fdcd:
        local_58 = local_48;
        std::__cxx11::string::_M_construct((ulong)&local_58,cVar6);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58,local_50,__val);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x30bfa6);
        local_98 = &local_88;
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_88 = *plVar12;
          lStack_80 = plVar10[3];
        }
        else {
          local_88 = *plVar12;
          local_98 = (long *)*plVar10;
        }
        local_90 = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_78 = &local_68;
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_68 = *plVar12;
          lStack_60 = plVar10[3];
        }
        else {
          local_68 = *plVar12;
          local_78 = (long *)*plVar10;
        }
        local_70 = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        pcVar2 = (sink->file_->data_)._M_str;
        if ((pcVar2 <= pcVar4) && (pcVar4 < pcVar2 + (sink->file_->data_)._M_len)) {
          name_01._M_str = (char *)local_78;
          name_01._M_len = local_70;
          RangeSink::AddFileRange(sink,"wasm_data",name_01,(long)pcVar4 - (long)pcVar2,filesize);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
      }
      else {
        pcVar2 = (sink->file_->data_)._M_str;
        if ((pcVar2 <= pcVar4) && (pcVar4 < pcVar2 + (sink->file_->data_)._M_len)) {
          name_00._M_str = (char *)p_Var9[2]._M_nxt;
          name_00._M_len = (size_t)p_Var9[3]._M_nxt;
          RangeSink::AddFileRange(sink,"wasm_data",name_00,(long)pcVar4 - (long)pcVar2,filesize);
        }
      }
      __val = __val + 1;
    } while (__val != (uint)local_38);
  }
  return;
}

Assistant:

void ReadDataSection(const Section& section, const IndexedNames& names,
                     RangeSink* sink) {
  string_view data = section.contents;
  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view segment = data;
    uint32_t mode = ReadVarUInt32(&data);
    if (mode > 1) THROW("multi-memory extension isn't supported");
    if (mode == 0) { // Active segment
      SkipInitializerExpression(&data);
    }

    uint32_t segment_size = ReadVarUInt32(&data);
    uint32_t total_size = segment_size + (data.data() - segment.data());

    segment = StrictSubstr(segment, 0, total_size);
    data = StrictSubstr(data, segment_size);

    auto iter = names.find(i);
    if (iter == names.end()) {
      std::string name = "data[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_data", name, segment);
    } else {
      sink->AddFileRange("wasm_data", iter->second, segment);
    }
  }
}